

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObject_private.hh
# Opt level: O0

void __thiscall
QPDFObject::ChildDescr::ChildDescr
          (ChildDescr *this,shared_ptr<QPDFObject> *parent,string_view *static_descr,
          string *var_descr)

{
  string *var_descr_local;
  string_view *static_descr_local;
  shared_ptr<QPDFObject> *parent_local;
  ChildDescr *this_local;
  
  std::weak_ptr<QPDFObject>::weak_ptr<QPDFObject,void>(&this->parent,parent);
  this->static_descr = static_descr;
  std::__cxx11::string::string((string *)&this->var_descr,(string *)var_descr);
  return;
}

Assistant:

ChildDescr(
            std::shared_ptr<QPDFObject> parent,
            std::string_view const& static_descr,
            std::string var_descr) :
            parent(parent),
            static_descr(static_descr),
            var_descr(var_descr)
        {
        }